

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AStateProvider_A_CustomPunch
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *t1;
  DObject *this;
  void *pvVar1;
  AWeapon *this_00;
  int iVar2;
  uint uVar3;
  VMValue *pVVar4;
  PClass *p;
  bool bVar5;
  int local_190;
  bool local_146;
  bool local_143;
  FSoundID local_140;
  FSoundID local_13c;
  AInventory *local_138;
  ABasicArmorBonus *armorbonus;
  FSoundID local_128;
  FName local_124;
  TAngle<double> local_120;
  TAngle<double> local_118;
  uint local_10c;
  int puffFlags;
  undefined1 local_100 [16];
  TAngle<double> local_f0;
  int local_e4;
  undefined1 auStack_e0 [4];
  int actualdamage;
  FTranslatedLineTarget t;
  DAngle pitch;
  DAngle angle;
  AWeapon *weapon;
  player_t *player;
  FSoundID local_98;
  FSoundID local_94;
  FSoundID MissSound;
  FSoundID local_8c;
  PClassInventory *pPStack_88;
  FSoundID MeleeSound;
  MetaClass *armorbonustype;
  double dStack_78;
  int lifestealmax;
  double lifesteal;
  double range;
  MetaClass *pufftype;
  int flags;
  bool norandom;
  int damage;
  FStateParamInfo *stateinfo;
  AStateProvider *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x816,
                  "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar5 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar5 = true, (param->field_0).field_1.atag != 1)) {
    bVar5 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar5) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x816,
                  "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  t1 = *(AActor **)&param->field_0;
  local_143 = true;
  if (t1 != (AActor *)0x0) {
    local_143 = DObject::IsKindOf((DObject *)t1,AActor::RegistrationInfo.MyClass);
  }
  if (local_143 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x816,
                  "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x816,
                  "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar5 = false;
  if ((param[1].field_0.field_3.Type == '\x03') &&
     (bVar5 = true, param[1].field_0.field_1.atag != 1)) {
    bVar5 = param[1].field_0.field_1.a == (void *)0x0;
  }
  if (bVar5) {
    this = (DObject *)param[1].field_0.field_1.a;
    local_146 = true;
    if (this != (DObject *)0x0) {
      local_146 = DObject::IsKindOf(this,AStateProvider::RegistrationInfo.MyClass);
    }
    if (local_146 == false) {
      __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AStateProvider))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x816,
                    "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    if (numparam < 3) {
      __assert_fail("(paramnum) < numparam",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x816,
                    "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    if (param[2].field_0.field_3.Type == '\x03') {
      pvVar1 = param[2].field_0.field_1.a;
      if (numparam < 4) {
        __assert_fail("(paramnum) < numparam",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x817,
                      "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      if (param[3].field_0.field_3.Type == '\0') {
        flags = param[3].field_0.i;
        if (numparam < 5) {
          pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
          if ((pVVar4->field_0).field_3.Type != '\0') {
            __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x818,
                          "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
          iVar2 = (pVVar4->field_0).i;
        }
        else {
          if (param[4].field_0.field_3.Type != '\0') {
            __assert_fail("(param[paramnum]).Type == REGT_INT",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x818,
                          "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          iVar2 = param[4].field_0.i;
        }
        if (numparam < 6) {
          pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
          if ((pVVar4->field_0).field_3.Type != '\0') {
            __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x819,
                          "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
          pufftype._4_4_ = (pVVar4->field_0).i;
        }
        else {
          if (param[5].field_0.field_3.Type != '\0') {
            __assert_fail("(param[paramnum]).Type == REGT_INT",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x819,
                          "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          pufftype._4_4_ = param[5].field_0.i;
        }
        if (numparam < 7) {
          pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,6);
          bVar5 = false;
          if ((pVVar4->field_0).field_3.Type == '\x03') {
            pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,6);
            bVar5 = true;
            if ((pVVar4->field_0).field_1.atag != 1) {
              pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,6);
              bVar5 = (pVVar4->field_0).field_1.a == (void *)0x0;
            }
          }
          if (!bVar5) {
            __assert_fail("(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x81a,
                          "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,6);
          range = (pVVar4->field_0).f;
        }
        else {
          bVar5 = false;
          if ((param[6].field_0.field_3.Type == '\x03') &&
             (bVar5 = true, param[6].field_0.field_1.atag != 1)) {
            bVar5 = param[6].field_0.field_1.a == (void *)0x0;
          }
          if (!bVar5) {
            __assert_fail("(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x81a,
                          "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          range = param[6].field_0.f;
        }
        if (numparam < 8) {
          pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,7);
          if ((pVVar4->field_0).field_3.Type != '\x01') {
            __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x81b,
                          "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,7);
          lifesteal = (pVVar4->field_0).f;
        }
        else {
          if (param[7].field_0.field_3.Type != '\x01') {
            __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x81b,
                          "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          lifesteal = param[7].field_0.f;
        }
        if (numparam < 9) {
          pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,8);
          if ((pVVar4->field_0).field_3.Type != '\x01') {
            __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x81c,
                          "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,8);
          dStack_78 = (pVVar4->field_0).f;
        }
        else {
          if (param[8].field_0.field_3.Type != '\x01') {
            __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x81c,
                          "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          dStack_78 = param[8].field_0.f;
        }
        if (numparam < 10) {
          pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,9);
          if ((pVVar4->field_0).field_3.Type != '\0') {
            __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x81d,
                          "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,9);
          armorbonustype._4_4_ = (pVVar4->field_0).i;
        }
        else {
          if (param[9].field_0.field_3.Type != '\0') {
            __assert_fail("(param[paramnum]).Type == REGT_INT",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x81d,
                          "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          armorbonustype._4_4_ = param[9].field_0.i;
        }
        if (numparam < 0xb) {
          pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,10);
          bVar5 = false;
          if ((pVVar4->field_0).field_3.Type == '\x03') {
            pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,10);
            bVar5 = true;
            if ((pVVar4->field_0).field_1.atag != 1) {
              pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,10);
              bVar5 = (pVVar4->field_0).field_1.a == (void *)0x0;
            }
          }
          if (!bVar5) {
            __assert_fail("(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x81e,
                          "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,10);
          pPStack_88 = (PClassInventory *)(pVVar4->field_0).field_1.a;
        }
        else {
          bVar5 = false;
          if ((param[10].field_0.field_3.Type == '\x03') &&
             (bVar5 = true, param[10].field_0.field_1.atag != 1)) {
            bVar5 = param[10].field_0.field_1.a == (void *)0x0;
          }
          if (!bVar5) {
            __assert_fail("(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x81e,
                          "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          pPStack_88 = (PClassInventory *)param[10].field_0.field_1.a;
        }
        FSoundID::FSoundID(&local_8c);
        if (numparam < 0xc) {
          pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,0xb);
          if ((pVVar4->field_0).field_3.Type != '\0') {
            __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x81f,
                          "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,0xb);
          FSoundID::FSoundID(&local_94,(pVVar4->field_0).i);
          FSoundID::operator=(&local_8c,&local_94);
        }
        else {
          if (param[0xb].field_0.field_3.Type != '\0') {
            __assert_fail("(param[paramnum]).Type == REGT_INT",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x81f,
                          "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          FSoundID::FSoundID(&MissSound,param[0xb].field_0.i);
          FSoundID::operator=(&local_8c,&MissSound);
        }
        FSoundID::FSoundID(&local_98);
        if (numparam < 0xd) {
          pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,0xc);
          if ((pVVar4->field_0).field_3.Type != '\0') {
            __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x820,
                          "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,0xc);
          FSoundID::FSoundID((FSoundID *)&player,(pVVar4->field_0).i);
          FSoundID::operator=(&local_98,(FSoundID *)&player);
        }
        else {
          if (param[0xc].field_0.field_3.Type != '\0') {
            __assert_fail("(param[paramnum]).Type == REGT_INT",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x820,
                          "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          FSoundID::FSoundID((FSoundID *)((long)&player + 4),param[0xc].field_0.i);
          FSoundID::operator=(&local_98,(FSoundID *)((long)&player + 4));
        }
        if (t1->player != (player_t *)0x0) {
          this_00 = t1->player->ReadyWeapon;
          TAngle<double>::TAngle(&pitch);
          TAngle<double>::TAngle((TAngle<double> *)&t.unlinked);
          FTranslatedLineTarget::FTranslatedLineTarget((FTranslatedLineTarget *)auStack_e0);
          if (iVar2 == 0) {
            iVar2 = FRandom::operator()(&pr_cwpunch);
            flags = (iVar2 % 8 + 1) * flags;
          }
          iVar2 = FRandom::Random2(&pr_cwpunch);
          TAngle<double>::operator+(&local_f0,(double)iVar2 * 0.02197265625);
          TAngle<double>::operator=(&pitch,&local_f0);
          if ((lifesteal == 0.0) && (!NAN(lifesteal))) {
            lifesteal = 64.0;
          }
          TAngle<double>::TAngle((TAngle<double> *)local_100,&pitch);
          TAngle<double>::TAngle((TAngle<double> *)&stack0xfffffffffffffef8,0.0);
          P_AimLineAttack((AActor *)(local_100 + 8),(DAngle *)t1,lifesteal,
                          (FTranslatedLineTarget *)local_100,(DAngle *)auStack_e0,
                          (int)&stack0xfffffffffffffef8,(AActor *)0x0,(AActor *)0x0);
          TAngle<double>::operator=((TAngle<double> *)&t.unlinked,(TAngle<double> *)(local_100 + 8))
          ;
          if (((((pufftype._4_4_ & 1) == 0) || ((AActor *)_auStack_e0 == (AActor *)0x0)) ||
              (this_00 == (AWeapon *)0x0)) ||
             (((t1->player == (player_t *)0x0 || (pvVar1 == (void *)0x0)) ||
              ((*(int *)((long)pvVar1 + 8) != 1 ||
               (bVar5 = AWeapon::DepleteAmmo(this_00,(bool)(this_00->bAltFire & 1),true,-1), bVar5))
              )))) {
            if (range == 0.0) {
              range = (double)PClass::FindActor(NAME_BulletPuff);
            }
            local_10c = 0;
            if ((pufftype._4_4_ & 8) != 0) {
              local_10c = 2;
            }
            local_10c = local_10c | 1;
            TAngle<double>::TAngle(&local_118,&pitch);
            TAngle<double>::TAngle(&local_120,(TAngle<double> *)&t.unlinked);
            FName::FName(&local_124,NAME_Melee);
            P_LineAttack(t1,&local_118,lifesteal,&local_120,flags,&local_124,(PClassActor *)range,
                         local_10c,(FTranslatedLineTarget *)auStack_e0,&local_e4);
            if ((AActor *)_auStack_e0 == (AActor *)0x0) {
              iVar2 = FSoundID::operator_cast_to_int(&local_98);
              if (iVar2 != 0) {
                FSoundID::FSoundID(&local_128,&local_98);
                S_Sound(t1,1,&local_128,1.0,1.0);
              }
            }
            else {
              bVar5 = false;
              if (0.0 < dStack_78) {
                TFlags<ActorFlag5,_unsigned_int>::operator&
                          ((TFlags<ActorFlag5,_unsigned_int> *)((long)&armorbonus + 4),
                           SUB84(_auStack_e0,0) +
                           (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_NODAMAGE|MF5_NOFORWARDFALL|
                           MF5_NODROPOFF));
                uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&armorbonus + 4));
                bVar5 = uVar3 == 0;
              }
              if (bVar5) {
                if ((pufftype._4_4_ & 0x20) == 0) {
                  P_GiveBody(t1,(int)((double)local_e4 * dStack_78),armorbonustype._4_4_);
                }
                else {
                  if (pPStack_88 == (PClassInventory *)0x0) {
                    p = PClass::FindClass("ArmorBonus");
                    pPStack_88 = dyn_cast<PClassInventory>((DObject *)p);
                  }
                  if (pPStack_88 != (PClassInventory *)0x0) {
                    bVar5 = PClass::IsDescendantOf
                                      ((PClass *)pPStack_88,
                                       ABasicArmorBonus::RegistrationInfo.MyClass);
                    if (!bVar5) {
                      __assert_fail("armorbonustype->IsDescendantOf(RUNTIME_CLASS(ABasicArmorBonus))"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                    ,0x852,
                                    "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                   );
                    }
                    local_138 = (AInventory *)Spawn(&pPStack_88->super_PClassActor);
                    *(int *)((long)&local_138[1].super_AActor.super_DThinker.super_DObject.ObjNext +
                            4) = (int)((double)local_e4 * dStack_78) *
                                 *(int *)((long)&local_138[1].super_AActor.super_DThinker.
                                                 super_DObject.ObjNext + 4);
                    if (armorbonustype._4_4_ < 1) {
                      local_190 = *(int *)&((DVector3 *)
                                           &local_138[1].super_AActor.super_DThinker.super_DObject.
                                            Class)->X;
                    }
                    else {
                      local_190 = armorbonustype._4_4_;
                    }
                    *(int *)&((DVector3 *)
                             &local_138[1].super_AActor.super_DThinker.super_DObject.Class)->X =
                         local_190;
                    TFlags<ActorFlag,_unsigned_int>::operator|=
                              (&(local_138->super_AActor).flags,MF_DROPPED);
                    AActor::ClearCounters(&local_138->super_AActor);
                    bVar5 = AInventory::CallTryPickup(local_138,t1,(AActor **)0x0);
                    if (!bVar5) {
                      (*(local_138->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])();
                    }
                  }
                }
              }
              if (this_00 != (AWeapon *)0x0) {
                iVar2 = FSoundID::operator_cast_to_int(&local_8c);
                if (iVar2 == 0) {
                  FSoundID::FSoundID(&local_140,
                                     &(this_00->super_AStateProvider).super_AInventory.super_AActor.
                                      AttackSound.super_FSoundID);
                  S_Sound(t1,1,&local_140,1.0,1.0);
                }
                else {
                  FSoundID::FSoundID(&local_13c,&local_8c);
                  S_Sound(t1,1,&local_13c,1.0,1.0);
                }
              }
              if ((pufftype._4_4_ & 0x10) == 0) {
                TAngle<double>::operator=(&(t1->Angles).Yaw,(TAngle<double> *)&t);
              }
              if ((pufftype._4_4_ & 4) != 0) {
                TFlags<ActorFlag,_unsigned_int>::operator|=(&t1->flags,MF_JUSTATTACKED);
              }
              if ((pufftype._4_4_ & 2) != 0) {
                P_DaggerAlert(t1,(AActor *)_auStack_e0);
              }
            }
          }
        }
        return 0;
      }
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x817,
                    "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    __assert_fail("param[paramnum].Type == REGT_POINTER",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x816,
                  "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x816,
                "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AStateProvider, A_CustomPunch)
{
	PARAM_ACTION_PROLOGUE(AStateProvider);
	PARAM_INT		(damage);
	PARAM_BOOL_DEF	(norandom);
	PARAM_INT_DEF	(flags);
	PARAM_CLASS_DEF	(pufftype, AActor);
	PARAM_FLOAT_DEF	(range);
	PARAM_FLOAT_DEF	(lifesteal);
	PARAM_INT_DEF	(lifestealmax);
	PARAM_CLASS_DEF	(armorbonustype, ABasicArmorBonus);
	PARAM_SOUND_DEF	(MeleeSound);
	PARAM_SOUND_DEF	(MissSound);

	if (!self->player)
		return 0;

	player_t *player = self->player;
	AWeapon *weapon = player->ReadyWeapon;


	DAngle angle;
	DAngle pitch;
	FTranslatedLineTarget t;
	int			actualdamage;

	if (!norandom)
		damage *= pr_cwpunch() % 8 + 1;

	angle = self->Angles.Yaw + pr_cwpunch.Random2() * (5.625 / 256);
	if (range == 0) range = DEFMELEERANGE;
	pitch = P_AimLineAttack (self, angle, range, &t);

	// only use ammo when actually hitting something!
	if ((flags & CPF_USEAMMO) && t.linetarget && weapon && ACTION_CALL_FROM_PSPRITE())
	{
		if (!weapon->DepleteAmmo(weapon->bAltFire, true))
			return 0;	// out of ammo
	}

	if (pufftype == NULL)
		pufftype = PClass::FindActor(NAME_BulletPuff);
	int puffFlags = LAF_ISMELEEATTACK | ((flags & CPF_NORANDOMPUFFZ) ? LAF_NORANDOMPUFFZ : 0);

	P_LineAttack (self, angle, range, pitch, damage, NAME_Melee, pufftype, puffFlags, &t, &actualdamage);

	if (!t.linetarget)
	{
		if (MissSound) S_Sound(self, CHAN_WEAPON, MissSound, 1, ATTN_NORM);
	}
	else
	{
		if (lifesteal > 0 && !(t.linetarget->flags5 & MF5_DONTDRAIN))
		{
			if (flags & CPF_STEALARMOR)
			{
				if (armorbonustype == NULL)
				{
					armorbonustype = dyn_cast<ABasicArmorBonus::MetaClass>(PClass::FindClass("ArmorBonus"));
				}
				if (armorbonustype != NULL)
				{
					assert(armorbonustype->IsDescendantOf(RUNTIME_CLASS(ABasicArmorBonus)));
					ABasicArmorBonus *armorbonus = static_cast<ABasicArmorBonus *>(Spawn(armorbonustype));
					armorbonus->SaveAmount *= int(actualdamage * lifesteal);
					armorbonus->MaxSaveAmount = lifestealmax <= 0 ? armorbonus->MaxSaveAmount : lifestealmax;
					armorbonus->flags |= MF_DROPPED;
					armorbonus->ClearCounters();

					if (!armorbonus->CallTryPickup(self))
					{
						armorbonus->Destroy ();
					}
				}
			}
			else
			{
				P_GiveBody (self, int(actualdamage * lifesteal), lifestealmax);
			}
		}
		if (weapon != NULL)
		{
			if (MeleeSound) S_Sound(self, CHAN_WEAPON, MeleeSound, 1, ATTN_NORM);
			else			S_Sound (self, CHAN_WEAPON, weapon->AttackSound, 1, ATTN_NORM);
		}

		if (!(flags & CPF_NOTURN))
		{
			// turn to face target
			self->Angles.Yaw = t.angleFromSource;
		}

		if (flags & CPF_PULLIN) self->flags |= MF_JUSTATTACKED;
		if (flags & CPF_DAGGER) P_DaggerAlert (self, t.linetarget);
	}
	return 0;
}